

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O2

int __thiscall ON_wString::ReplaceWhiteSpace(ON_wString *this,wchar_t token,wchar_t *whitespace)

{
  wchar_t wVar1;
  int iVar2;
  bool bVar3;
  wchar_t *pwVar4;
  ON_Internal_Empty_wString *pOVar5;
  wchar_t *pwVar6;
  int iVar7;
  wchar_t *pwVar8;
  long lVar9;
  
  pwVar8 = this->m_s;
  if (pwVar8 == (wchar_t *)0x0) {
LAB_0066e939:
    iVar7 = 0;
  }
  else {
    pwVar6 = pwVar8 + pwVar8[-2];
    if ((whitespace == (wchar_t *)0x0) || (*whitespace == L'\0')) {
      lVar9 = 0;
      do {
        if (pwVar6 <= pwVar8) goto LAB_0066e939;
        wVar1 = *pwVar8;
        lVar9 = lVar9 + 0x100000000;
      } while ((wVar1 != L'\x7f') && (pwVar8 = pwVar8 + 1, 0x1f < (uint)(wVar1 + L'\xffffffff')));
      CopyArray(this);
      pwVar8 = this->m_s;
      pOVar5 = &empty_wstring;
      if (pwVar8 != (wchar_t *)0x0) {
        pOVar5 = (ON_Internal_Empty_wString *)(pwVar8 + -3);
      }
      iVar2 = (pOVar5->header).string_length;
      (pwVar8 + (lVar9 >> 0x20))[-1] = token;
      iVar7 = 1;
      pwVar6 = pwVar8 + (lVar9 >> 0x20);
      while (pwVar4 = pwVar6, pwVar4 < pwVar8 + iVar2) {
        pwVar6 = pwVar4 + 1;
        if ((*pwVar4 == L'\x7f') || ((uint)(*pwVar4 + L'\xffffffff') < 0x20)) {
          *pwVar4 = token;
          iVar7 = iVar7 + 1;
        }
      }
    }
    else {
      lVar9 = 0;
      do {
        if (pwVar6 <= pwVar8) goto LAB_0066e939;
        wVar1 = *pwVar8;
        pwVar8 = pwVar8 + 1;
        bVar3 = IsWhiteSpaceHelper(wVar1,whitespace);
        lVar9 = lVar9 + 0x100000000;
      } while (!bVar3);
      CopyArray(this);
      pwVar8 = this->m_s;
      pOVar5 = &empty_wstring;
      if (pwVar8 != (wchar_t *)0x0) {
        pOVar5 = (ON_Internal_Empty_wString *)(pwVar8 + -3);
      }
      iVar2 = (pOVar5->header).string_length;
      (pwVar8 + (lVar9 >> 0x20))[-1] = token;
      iVar7 = 1;
      pwVar6 = pwVar8 + (lVar9 >> 0x20);
      while (pwVar4 = pwVar6, pwVar4 < pwVar8 + iVar2) {
        bVar3 = IsWhiteSpaceHelper(*pwVar4,whitespace);
        pwVar6 = pwVar4 + 1;
        if (bVar3) {
          *pwVar4 = token;
          iVar7 = iVar7 + 1;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int ON_wString::ReplaceWhiteSpace( wchar_t token, const wchar_t* whitespace )
{
  wchar_t* s0;
  wchar_t* s1;
  int n;
  wchar_t c;

  if ( 0 == (s0 = m_s) )
    return 0;
  s1 = s0 + Length();
  if ( whitespace && *whitespace )
  {
    while( s0 < s1 )
    {
      if (IsWhiteSpaceHelper(*s0++,whitespace))
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s1 = m_s + Length();
        s0[-1] = token;
        n = 1;
        while ( s0 < s1 )
        {
          if ( IsWhiteSpaceHelper(*s0++,whitespace) )
          {
            s0[-1] = token;
            n++;
          }
        }
        return n;
      }
    }
  }
  else
  {
    while( s0 < s1 )
    {
      c = *s0++;
      if ( (1 <= c && c <= 32) || 127 == c )
      {
        // need to modify this string
        n = ((int)(s0 - m_s)); // keep win64 happy with (int) cast
        CopyArray(); // may change m_s if string has multiple refs
        s0 = m_s + n;
        s1 = m_s + Length();
        s0[-1] = token;
        n = 1;
        while ( s0 < s1 )
        {
          c = *s0++;
          if ( (1 <= c && c <= 32) || 127 == c )
          {
            s0[-1] = token;
            n++;
          }
        }
        return n;
      }
    }
  }
  return 0;
}